

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O1

void __thiscall TEST_SimpleString_Addition_Test::testBody(TEST_SimpleString_Addition_Test *this)

{
  bool bVar1;
  UtestShell *pUVar2;
  char *pcVar3;
  char *pcVar4;
  TestTerminator *pTVar5;
  SimpleString SStack_78;
  SimpleString s4;
  SimpleString s3;
  SimpleString local_48;
  SimpleString s2;
  SimpleString s1;
  
  SimpleString::SimpleString(&s1,"hello!");
  SimpleString::SimpleString(&s2,"goodbye!");
  SimpleString::SimpleString(&s3,"hello!goodbye!");
  SimpleString::SimpleString(&s4,"");
  SimpleString::operator+(&SStack_78,&s1);
  SimpleString::operator=(&s4,&SStack_78);
  SimpleString::~SimpleString(&SStack_78);
  bVar1 = operator!=(&s3,&s4);
  if (bVar1) {
    bVar1 = operator!=(&s4,&s4);
    if (bVar1) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1c])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
                 ,0x139);
    }
    bVar1 = operator!=(&s3,&s3);
    if (bVar1) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1c])
                (pUVar2,
                 "WARNING:\n\tThe \"Expected Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
                 ,0x139);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(&SStack_78);
    pcVar3 = SimpleString::asCharString(&SStack_78);
    StringFrom(&local_48);
    pcVar4 = SimpleString::asCharString(&local_48);
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar3,pcVar4,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
               ,0x139,pTVar5);
    SimpleString::~SimpleString(&local_48);
    SimpleString::~SimpleString(&SStack_78);
  }
  else {
    pUVar2 = UtestShell::getCurrent();
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
               ,0x139,pTVar5);
  }
  SimpleString::~SimpleString(&s4);
  SimpleString::~SimpleString(&s3);
  SimpleString::~SimpleString(&s2);
  SimpleString::~SimpleString(&s1);
  return;
}

Assistant:

TEST(SimpleString, Addition)
{
    SimpleString s1("hello!");
    SimpleString s2("goodbye!");
    SimpleString s3("hello!goodbye!");
    SimpleString s4;
    s4 = s1 + s2;

    CHECK_EQUAL(s3, s4);
}